

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkBottom(Abc_Ntk_t *pNtk,int Level)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  Abc_Ntk_t *pNtkNew;
  char *pcVar4;
  Vec_Ptr_t *pVVar5;
  Abc_Obj_t *pAVar6;
  long lVar7;
  long lVar8;
  char Buffer [500];
  char local_228 [504];
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                  ,0x2f7,"Abc_Ntk_t *Abc_NtkBottom(Abc_Ntk_t *, int)");
  }
  if (pNtk->nObjCounts[8] != 0) {
    __assert_fail("Abc_NtkLatchNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcNtk.c"
                  ,0x2f8,"Abc_Ntk_t *Abc_NtkBottom(Abc_Ntk_t *, int)");
  }
  pNtkNew = Abc_NtkAlloc(ABC_NTK_LOGIC,pNtk->ntkFunc,1);
  sprintf(local_228,"%s%s",pNtk->pName,"_bot");
  pcVar4 = Extra_UtilStrsav(local_228);
  pNtkNew->pName = pcVar4;
  Abc_NtkCleanCopy(pNtk);
  pVVar5 = pNtk->vPis;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      Abc_NtkDupObj(pNtkNew,(Abc_Obj_t *)pVVar5->pArray[lVar8],1);
      lVar8 = lVar8 + 1;
      pVVar5 = pNtk->vPis;
    } while (lVar8 < pVVar5->nSize);
  }
  pVVar5 = pNtk->vObjs;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      pAVar6 = (Abc_Obj_t *)pVVar5->pArray[lVar8];
      if (((pAVar6 != (Abc_Obj_t *)0x0) && ((pAVar6->field_6).pTemp == (void *)0x0)) &&
         ((int)(*(uint *)&pAVar6->field_0x14 >> 0xc) <= Level &&
          (*(uint *)&pAVar6->field_0x14 & 0xf) == 7)) {
        Abc_NtkDupObj(pNtkNew,pAVar6,0);
      }
      lVar8 = lVar8 + 1;
      pVVar5 = pNtk->vObjs;
    } while (lVar8 < pVVar5->nSize);
  }
  pVVar5 = pNtk->vObjs;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      plVar1 = (long *)pVVar5->pArray[lVar8];
      if ((plVar1 != (long *)0x0) && (0 < *(int *)((long)plVar1 + 0x1c))) {
        lVar7 = 0;
        do {
          if (((Abc_Obj_t *)plVar1[8] != (Abc_Obj_t *)0x0) &&
             (pAVar6 = *(Abc_Obj_t **)
                        (*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                  (long)*(int *)(plVar1[4] + lVar7 * 4) * 8) + 0x40),
             pAVar6 != (Abc_Obj_t *)0x0)) {
            Abc_ObjAddFanin((Abc_Obj_t *)plVar1[8],pAVar6);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < *(int *)((long)plVar1 + 0x1c));
      }
      lVar8 = lVar8 + 1;
      pVVar5 = pNtk->vObjs;
    } while (lVar8 < pVVar5->nSize);
  }
  pVVar5 = pNtk->vObjs;
  if (0 < pVVar5->nSize) {
    lVar8 = 0;
    do {
      plVar1 = (long *)pVVar5->pArray[lVar8];
      if ((plVar1 != (long *)0x0) && (0 < *(int *)((long)plVar1 + 0x1c))) {
        lVar7 = 0;
        do {
          if (((plVar1[8] == 0) &&
              (lVar2 = *(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                (long)*(int *)(plVar1[4] + lVar7 * 4) * 8),
              *(long *)(lVar2 + 0x40) != 0)) && ((*(uint *)(lVar2 + 0x14) & 0xf) == 7)) {
            pAVar6 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_PO);
            Abc_ObjAddFanin(pAVar6,*(Abc_Obj_t **)(lVar2 + 0x40));
            pcVar4 = Abc_ObjName(pAVar6);
            Abc_ObjAssignName(pAVar6,pcVar4,(char *)0x0);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < *(int *)((long)plVar1 + 0x1c));
      }
      lVar8 = lVar8 + 1;
      pVVar5 = pNtk->vObjs;
    } while (lVar8 < pVVar5->nSize);
  }
  iVar3 = Abc_NtkCheck(pNtkNew);
  if (iVar3 == 0) {
    fwrite("Abc_NtkBottom(): Network check has failed.\n",0x2b,1,_stdout);
  }
  return pNtkNew;
}

Assistant:

Abc_Ntk_t * Abc_NtkBottom( Abc_Ntk_t * pNtk, int Level )
{
    char Buffer[500];
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    assert( Abc_NtkIsLogic(pNtk) );
    assert( Abc_NtkLatchNum(pNtk) == 0 );

    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    sprintf( Buffer, "%s%s", pNtk->pName, "_bot" );
    pNtkNew->pName = Extra_UtilStrsav(Buffer);

    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, 1 );

    // copy the internal nodes
    // duplicate the nets and nodes (CIs/COs/latches already dupped)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->pCopy == NULL && Abc_ObjIsNode(pObj) && Abc_ObjLevel(pObj) <= Level )
            Abc_NtkDupObj(pNtkNew, pObj, 0);
    // reconnect all objects (no need to transfer attributes on edges)
    Abc_NtkForEachObj( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( pObj->pCopy && pFanin->pCopy )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );

    // create new primary outputs
    Abc_NtkForEachObj( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( !pObj->pCopy && pFanin->pCopy && Abc_ObjIsNode(pFanin) )
            {
                Abc_Obj_t * pNodeNew = Abc_NtkCreatePo(pNtkNew);
                Abc_ObjAddFanin( pNodeNew, pFanin->pCopy );
                Abc_ObjAssignName( pNodeNew, Abc_ObjName(pNodeNew), NULL );
            }

    // perform the final check
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkBottom(): Network check has failed.\n" );
    return pNtkNew;
}